

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_warnings_tests.cpp
# Opt level: O2

void __thiscall node_warnings_tests::warnings::test_method(warnings *this)

{
  long lVar1;
  bilingual_str message;
  bilingual_str message_00;
  bilingual_str message_01;
  bilingual_str message_02;
  bool bVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  _Move_assign_alias<kernel::Warning,_node::Warning> in_stack_fffffffffffffb78;
  _Variant_storage_alias<kernel::Warning,_node::Warning> id;
  _Variant_storage_alias<kernel::Warning,_node::Warning> id_00;
  _Variant_storage_alias<kernel::Warning,_node::Warning> id_01;
  _Move_assign_alias<kernel::Warning,_node::Warning> _Var5;
  _Variant_storage_alias<kernel::Warning,_node::Warning> id_02;
  _Variant_storage_alias<kernel::Warning,_node::Warning> id_03;
  check_type cVar9;
  undefined8 in_stack_fffffffffffffb88;
  undefined8 in_stack_fffffffffffffb90;
  undefined8 in_stack_fffffffffffffb98;
  undefined8 in_stack_fffffffffffffba0;
  char *pcVar6;
  pointer pbVar7;
  pointer pbVar8;
  pointer in_stack_fffffffffffffbb8;
  undefined1 *local_440;
  undefined1 *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  undefined1 *local_410;
  undefined1 *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  undefined1 *local_3e0;
  undefined1 *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  undefined1 *local_3b0;
  undefined1 *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  lazy_ostream local_200;
  undefined1 *local_1f0;
  vector<bilingual_str,_std::allocator<bilingual_str>_> *local_1e8;
  element_type *local_1e0;
  element_type *local_1d8;
  shared_count sStack_1d0;
  vector<bilingual_str,_std::allocator<bilingual_str>_> messages;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  bilingual_str local_190;
  bilingual_str local_150;
  bilingual_str local_110;
  bilingual_str local_d0;
  Warnings warnings;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ::node::Warnings::Warnings(&warnings);
  ::node::Warnings::Unset
            (&warnings,
             (warning_type)
             in_stack_fffffffffffffb78.super__Copy_assign_alias<kernel::Warning,_node::Warning>.
             super__Move_ctor_alias<kernel::Warning,_node::Warning>.
             super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
             super__Variant_storage_alias<kernel::Warning,_node::Warning>);
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/node_warnings_tests.cpp"
  ;
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x1b;
  file.m_begin = (iterator)&local_1a0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1b0,msg);
  ::node::Warnings::GetMessages
            ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)&local_1e0,&warnings);
  messages.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = local_1d8 == local_1e0;
  messages.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  messages.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e8 = (vector<bilingual_str,_std::allocator<bilingual_str>_> *)&stack0xfffffffffffffba8;
  pcVar6 = "warnings.GetMessages().size() == 0";
  pbVar7 = (pointer)0xbb5a3d;
  local_200.m_empty = false;
  local_200._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_1f0 = boost::unit_test::lazy_ostream::inst;
  local_210 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/node_warnings_tests.cpp"
  ;
  local_208 = "";
  id._M_u = (_Variadic_union<kernel::Warning,_node::Warning>)0x0;
  id._M_index = '\0';
  id._5_3_ = 0;
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&messages,&local_200,1,0,WARN,_cVar9,(size_t)&local_210,0x1b);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &messages.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<bilingual_str,_std::allocator<bilingual_str>_>::~vector
            ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)&local_1e0);
  local_220 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/node_warnings_tests.cpp"
  ;
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  file_00.m_end = (iterator)0x1d;
  file_00.m_begin = (iterator)&local_220;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_230,
             msg_00);
  _(&local_d0,(ConstevalStringLiteral)0xbb5a3e);
  message.original._M_string_length = in_stack_fffffffffffffb88;
  message.original._M_dataplus._M_p = (pointer)_cVar9;
  message.original.field_2._M_allocated_capacity = in_stack_fffffffffffffb90;
  message.original.field_2._8_8_ = in_stack_fffffffffffffb98;
  message.translated._M_dataplus._M_p = (pointer)in_stack_fffffffffffffba0;
  message.translated._M_string_length = (size_type)pcVar6;
  message.translated.field_2._M_allocated_capacity = (size_type)pbVar7;
  message.translated.field_2._8_8_ = in_stack_fffffffffffffbb8;
  messages.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = ::node::Warnings::Set(&warnings,(warning_type)id,message)
  ;
  messages.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  messages.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e0 = (element_type *)0xbb5a48;
  local_1d8 = (element_type *)0xbb5a6f;
  local_200.m_empty = false;
  local_200._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_1f0 = boost::unit_test::lazy_ostream::inst;
  local_240 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/node_warnings_tests.cpp"
  ;
  local_238 = "";
  id_00._M_u = (_Variadic_union<kernel::Warning,_node::Warning>)0x0;
  id_00._M_index = '\0';
  id_00._5_3_ = 0;
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_1e8 = (vector<bilingual_str,_std::allocator<bilingual_str>_> *)&local_1e0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&messages,&local_200,1,0,WARN,_cVar9,(size_t)&local_240,0x1d);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &messages.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  bilingual_str::~bilingual_str(&local_d0);
  local_250 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/node_warnings_tests.cpp"
  ;
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar4;
  msg_01.m_begin = pvVar3;
  file_01.m_end = (iterator)0x1e;
  file_01.m_begin = (iterator)&local_250;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_260,
             msg_01);
  _(&local_110,(ConstevalStringLiteral)0xbb5a70);
  message_00.original._M_string_length = in_stack_fffffffffffffb88;
  message_00.original._M_dataplus._M_p = (pointer)_cVar9;
  message_00.original.field_2._M_allocated_capacity = in_stack_fffffffffffffb90;
  message_00.original.field_2._8_8_ = in_stack_fffffffffffffb98;
  message_00.translated._M_dataplus._M_p = (pointer)in_stack_fffffffffffffba0;
  message_00.translated._M_string_length = (size_type)pcVar6;
  message_00.translated.field_2._M_allocated_capacity = (size_type)pbVar7;
  message_00.translated.field_2._8_8_ = in_stack_fffffffffffffbb8;
  messages.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       ::node::Warnings::Set(&warnings,(warning_type)id_00,message_00);
  messages.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  messages.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e0 = (element_type *)0xbb5a7a;
  local_1d8 = (element_type *)0xbb5aa1;
  local_200.m_empty = false;
  local_200._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_1f0 = boost::unit_test::lazy_ostream::inst;
  local_270 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/node_warnings_tests.cpp"
  ;
  local_268 = "";
  id_01._M_u = (_Variadic_union<kernel::Warning,_node::Warning>)0x0;
  id_01._M_index = '\0';
  id_01._5_3_ = 0;
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_1e8 = (vector<bilingual_str,_std::allocator<bilingual_str>_> *)&local_1e0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&messages,&local_200,1,0,WARN,_cVar9,(size_t)&local_270,0x1e);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &messages.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  bilingual_str::~bilingual_str(&local_110);
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/node_warnings_tests.cpp"
  ;
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar4;
  msg_02.m_begin = pvVar3;
  file_02.m_end = (iterator)0x20;
  file_02.m_begin = (iterator)&local_280;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_290,
             msg_02);
  messages.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = ::node::Warnings::Unset(&warnings,(warning_type)id_01);
  messages.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  messages.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e0 = (element_type *)0xbb5aa3;
  local_1d8 = (element_type *)0xbb5abc;
  local_200.m_empty = false;
  local_200._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_1f0 = boost::unit_test::lazy_ostream::inst;
  local_2a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/node_warnings_tests.cpp"
  ;
  local_298 = "";
  _Var5.super__Copy_assign_alias<kernel::Warning,_node::Warning>.
  super__Move_ctor_alias<kernel::Warning,_node::Warning>.
  super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
  super__Variant_storage_alias<kernel::Warning,_node::Warning> =
       (_Copy_assign_alias<kernel::Warning,_node::Warning>)
       (_Move_ctor_alias<kernel::Warning,_node::Warning>)0x0;
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_1e8 = (vector<bilingual_str,_std::allocator<bilingual_str>_> *)&local_1e0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&messages,&local_200,1,0,WARN,_cVar9,(size_t)&local_2a0,0x20);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &messages.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_2b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/node_warnings_tests.cpp"
  ;
  local_2a8 = "";
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pvVar4;
  msg_03.m_begin = pvVar3;
  file_03.m_end = &DAT_00000022;
  file_03.m_begin = (iterator)&local_2b0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_2c0,
             msg_03);
  bVar2 = ::node::Warnings::Unset
                    (&warnings,
                     (warning_type)
                     _Var5.super__Copy_assign_alias<kernel::Warning,_node::Warning>.
                     super__Move_ctor_alias<kernel::Warning,_node::Warning>.
                     super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
                     super__Variant_storage_alias<kernel::Warning,_node::Warning>);
  messages.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = !bVar2;
  messages.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  messages.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e0 = (element_type *)0xbb5aa2;
  local_1d8 = (element_type *)0xbb5abc;
  local_200.m_empty = false;
  local_200._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_1f0 = boost::unit_test::lazy_ostream::inst;
  local_2d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/node_warnings_tests.cpp"
  ;
  local_2c8 = "";
  id_02._M_u = (_Variadic_union<kernel::Warning,_node::Warning>)0x0;
  id_02._M_index = '\0';
  id_02._5_3_ = 0;
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_1e8 = (vector<bilingual_str,_std::allocator<bilingual_str>_> *)&local_1e0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&messages,&local_200,1,0,WARN,_cVar9,(size_t)&local_2d0,0x22);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &messages.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_2e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/node_warnings_tests.cpp"
  ;
  local_2d8 = "";
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = pvVar4;
  msg_04.m_begin = pvVar3;
  file_04.m_end = (iterator)0x24;
  file_04.m_begin = (iterator)&local_2e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_2f0,
             msg_04);
  _(&local_150,(ConstevalStringLiteral)0xbb5abd);
  message_01.original._M_string_length = in_stack_fffffffffffffb88;
  message_01.original._M_dataplus._M_p = (pointer)_cVar9;
  message_01.original.field_2._M_allocated_capacity = in_stack_fffffffffffffb90;
  message_01.original.field_2._8_8_ = in_stack_fffffffffffffb98;
  message_01.translated._M_dataplus._M_p = (pointer)in_stack_fffffffffffffba0;
  message_01.translated._M_string_length = (size_type)pcVar6;
  message_01.translated.field_2._M_allocated_capacity = (size_type)pbVar7;
  message_01.translated.field_2._8_8_ = in_stack_fffffffffffffbb8;
  messages.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       ::node::Warnings::Set(&warnings,(warning_type)id_02,message_01);
  messages.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  messages.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e0 = (element_type *)0xbb5ad4;
  local_1d8 = (element_type *)0xbb5b08;
  local_200.m_empty = false;
  local_200._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_1f0 = boost::unit_test::lazy_ostream::inst;
  local_300 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/node_warnings_tests.cpp"
  ;
  local_2f8 = "";
  id_03._M_u = (_Variadic_union<kernel::Warning,_node::Warning>)0x0;
  id_03._M_index = '\0';
  id_03._5_3_ = 0;
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_1e8 = (vector<bilingual_str,_std::allocator<bilingual_str>_> *)&local_1e0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&messages,&local_200,1,0,WARN,_cVar9,(size_t)&local_300,0x24);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &messages.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  bilingual_str::~bilingual_str(&local_150);
  local_310 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/node_warnings_tests.cpp"
  ;
  local_308 = "";
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = pvVar4;
  msg_05.m_begin = pvVar3;
  file_05.m_end = (iterator)0x26;
  file_05.m_begin = (iterator)&local_310;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_320,
             msg_05);
  _(&local_190,(ConstevalStringLiteral)0xbb5b09);
  message_02.original._M_string_length = in_stack_fffffffffffffb88;
  message_02.original._M_dataplus._M_p = (pointer)_cVar9;
  message_02.original.field_2._M_allocated_capacity = in_stack_fffffffffffffb90;
  message_02.original.field_2._8_8_ = in_stack_fffffffffffffb98;
  message_02.translated._M_dataplus._M_p = (pointer)in_stack_fffffffffffffba0;
  message_02.translated._M_string_length = (size_type)pcVar6;
  message_02.translated.field_2._M_allocated_capacity = (size_type)pbVar7;
  message_02.translated.field_2._8_8_ = in_stack_fffffffffffffbb8;
  bVar2 = ::node::Warnings::Set(&warnings,(warning_type)id_03,message_02);
  messages.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = !bVar2;
  messages.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  messages.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e0 = (element_type *)0xbb5b20;
  local_1d8 = (element_type *)0xbb5b55;
  local_200.m_empty = false;
  local_200._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_1f0 = boost::unit_test::lazy_ostream::inst;
  local_330 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/node_warnings_tests.cpp"
  ;
  local_328 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_1e8 = (vector<bilingual_str,_std::allocator<bilingual_str>_> *)&local_1e0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&messages,&local_200,1,0,WARN,_cVar9,(size_t)&local_330,0x26);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &messages.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  bilingual_str::~bilingual_str(&local_190);
  ::node::Warnings::GetMessages(&messages,&warnings);
  local_340 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/node_warnings_tests.cpp"
  ;
  local_338 = "";
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = pvVar4;
  msg_06.m_begin = pvVar3;
  file_06.m_end = (iterator)0x2a;
  file_06.m_begin = (iterator)&local_340;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_350,
             msg_06);
  local_1d8 = (element_type *)0x0;
  sStack_1d0.pi_ = (sp_counted_base *)0x0;
  local_200.m_empty = false;
  local_200._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_1f0 = boost::unit_test::lazy_ostream::inst;
  local_360 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/node_warnings_tests.cpp"
  ;
  local_358 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_1e8 = (vector<bilingual_str,_std::allocator<bilingual_str>_> *)&stack0xfffffffffffffba8;
  local_1e0._0_1_ =
       (class_property<bool>)
       (class_property<bool>)
       ((long)messages.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
              super__Vector_impl_data._M_finish -
        CONCAT71(messages.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
                 super__Vector_impl_data._M_start._1_7_,
                 messages.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
                 super__Vector_impl_data._M_start._0_1_) == 0x80);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_1e0,&local_200,1,0,WARN,_cVar9,(size_t)&local_360,0x2a);
  boost::detail::shared_count::~shared_count(&sStack_1d0);
  local_370 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/node_warnings_tests.cpp"
  ;
  local_368 = "";
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = pvVar4;
  msg_07.m_begin = pvVar3;
  file_07.m_end = (iterator)0x2b;
  file_07.m_begin = (iterator)&local_370;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_380,
             msg_07);
  local_1e0._0_1_ =
       (class_property<bool>)
       std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT71(messages.
                                super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>.
                                _M_impl.super__Vector_impl_data._M_start._1_7_,
                                messages.
                                super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>.
                                _M_impl.super__Vector_impl_data._M_start._0_1_),"warning 1");
  local_1d8 = (element_type *)0x0;
  sStack_1d0.pi_ = (sp_counted_base *)0x0;
  local_200.m_empty = false;
  local_200._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_1f0 = boost::unit_test::lazy_ostream::inst;
  local_390 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/node_warnings_tests.cpp"
  ;
  local_388 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_1e8 = (vector<bilingual_str,_std::allocator<bilingual_str>_> *)&stack0xfffffffffffffba8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_1e0,&local_200,1,0,WARN,_cVar9,(size_t)&local_390,0x2b);
  boost::detail::shared_count::~shared_count(&sStack_1d0);
  local_3a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/node_warnings_tests.cpp"
  ;
  local_398 = "";
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = pvVar4;
  msg_08.m_begin = pvVar3;
  file_08.m_end = (iterator)0x2c;
  file_08.m_begin = (iterator)&local_3a0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_3b0,
             msg_08);
  local_1e0._0_1_ =
       (class_property<bool>)
       std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (CONCAT71(messages.
                                 super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>.
                                 _M_impl.super__Vector_impl_data._M_start._1_7_,
                                 messages.
                                 super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>.
                                 _M_impl.super__Vector_impl_data._M_start._0_1_) + 0x40),
                       "warning 2 - revision 1");
  local_1d8 = (element_type *)0x0;
  sStack_1d0.pi_ = (sp_counted_base *)0x0;
  local_200.m_empty = false;
  local_200._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_1f0 = boost::unit_test::lazy_ostream::inst;
  local_3c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/node_warnings_tests.cpp"
  ;
  local_3b8 = "";
  _Var5.super__Copy_assign_alias<kernel::Warning,_node::Warning>.
  super__Move_ctor_alias<kernel::Warning,_node::Warning>.
  super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
  super__Variant_storage_alias<kernel::Warning,_node::Warning> =
       (_Copy_assign_alias<kernel::Warning,_node::Warning>)
       (_Move_ctor_alias<kernel::Warning,_node::Warning>)0x0;
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_1e8 = (vector<bilingual_str,_std::allocator<bilingual_str>_> *)&stack0xfffffffffffffba8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_1e0,&local_200,1,0,WARN,_cVar9,(size_t)&local_3c0,0x2c);
  boost::detail::shared_count::~shared_count(&sStack_1d0);
  local_3d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/node_warnings_tests.cpp"
  ;
  local_3c8 = "";
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_09.m_end = pvVar4;
  msg_09.m_begin = pvVar3;
  file_09.m_end = (iterator)0x2f;
  file_09.m_begin = (iterator)&local_3d0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_3e0,
             msg_09);
  local_1e0._0_1_ =
       (class_property<bool>)
       ::node::Warnings::Unset
                 (&warnings,
                  (warning_type)
                  _Var5.super__Copy_assign_alias<kernel::Warning,_node::Warning>.
                  super__Move_ctor_alias<kernel::Warning,_node::Warning>.
                  super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
                  super__Variant_storage_alias<kernel::Warning,_node::Warning>);
  local_1d8 = (element_type *)0x0;
  sStack_1d0.pi_ = (sp_counted_base *)0x0;
  local_200.m_empty = false;
  local_200._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_1f0 = boost::unit_test::lazy_ostream::inst;
  local_3f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/node_warnings_tests.cpp"
  ;
  local_3e8 = "";
  _Var5.super__Copy_assign_alias<kernel::Warning,_node::Warning>.
  super__Move_ctor_alias<kernel::Warning,_node::Warning>.
  super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
  super__Variant_storage_alias<kernel::Warning,_node::Warning> =
       (_Copy_assign_alias<kernel::Warning,_node::Warning>)
       (_Move_ctor_alias<kernel::Warning,_node::Warning>)0x0;
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_1e8 = (vector<bilingual_str,_std::allocator<bilingual_str>_> *)&stack0xfffffffffffffba8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_1e0,&local_200,1,0,WARN,_cVar9,(size_t)&local_3f0,0x2f);
  boost::detail::shared_count::~shared_count(&sStack_1d0);
  local_400 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/node_warnings_tests.cpp"
  ;
  local_3f8 = "";
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_10.m_end = pvVar4;
  msg_10.m_begin = pvVar3;
  file_10.m_end = (iterator)0x30;
  file_10.m_begin = (iterator)&local_400;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_410,
             msg_10);
  local_1e0._0_1_ =
       (class_property<bool>)
       ::node::Warnings::Unset
                 (&warnings,
                  (warning_type)
                  _Var5.super__Copy_assign_alias<kernel::Warning,_node::Warning>.
                  super__Move_ctor_alias<kernel::Warning,_node::Warning>.
                  super__Copy_ctor_alias<kernel::Warning,_node::Warning>.
                  super__Variant_storage_alias<kernel::Warning,_node::Warning>);
  local_1d8 = (element_type *)0x0;
  sStack_1d0.pi_ = (sp_counted_base *)0x0;
  pbVar7 = (pointer)0xbb5aa3;
  pbVar8 = (pointer)0xbb5abc;
  local_200.m_empty = false;
  local_200._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_1f0 = boost::unit_test::lazy_ostream::inst;
  local_420 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/node_warnings_tests.cpp"
  ;
  local_418 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  local_1e8 = (vector<bilingual_str,_std::allocator<bilingual_str>_> *)&stack0xfffffffffffffba8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_1e0,&local_200,1,0,WARN,_cVar9,(size_t)&local_420,0x30);
  boost::detail::shared_count::~shared_count(&sStack_1d0);
  local_430 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/node_warnings_tests.cpp"
  ;
  local_428 = "";
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_11.m_end = pvVar4;
  msg_11.m_begin = pvVar3;
  file_11.m_end = (iterator)0x31;
  file_11.m_begin = (iterator)&local_430;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_440,
             msg_11);
  ::node::Warnings::GetMessages
            ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)&stack0xfffffffffffffba8,
             &warnings);
  local_1e0 = (element_type *)CONCAT71(local_1e0._1_7_,pbVar8 == pbVar7);
  local_1d8 = (element_type *)0x0;
  sStack_1d0.pi_ = (sp_counted_base *)0x0;
  local_1e8 = (vector<bilingual_str,_std::allocator<bilingual_str>_> *)&stack0xfffffffffffffb98;
  local_200.m_empty = false;
  local_200._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_1f0 = boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_1e0,&local_200,1,0,WARN,_cVar9,
             (size_t)&stack0xfffffffffffffb88,0x31);
  boost::detail::shared_count::~shared_count(&sStack_1d0);
  std::vector<bilingual_str,_std::allocator<bilingual_str>_>::~vector
            ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)&stack0xfffffffffffffba8);
  std::vector<bilingual_str,_std::allocator<bilingual_str>_>::~vector(&messages);
  std::
  _Rb_tree<std::variant<kernel::Warning,_node::Warning>,_std::pair<const_std::variant<kernel::Warning,_node::Warning>,_bilingual_str>,_std::_Select1st<std::pair<const_std::variant<kernel::Warning,_node::Warning>,_bilingual_str>_>,_std::less<std::variant<kernel::Warning,_node::Warning>_>,_std::allocator<std::pair<const_std::variant<kernel::Warning,_node::Warning>,_bilingual_str>_>_>
  ::~_Rb_tree(&warnings.m_warnings._M_t);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(warnings)
{
    node::Warnings warnings;
    // On pre-release builds, a warning is generated automatically
    warnings.Unset(node::Warning::PRE_RELEASE_TEST_BUILD);

    // For these tests, we don't care what the exact warnings are, so
    // just refer to them as warning_1 and warning_2
    const auto warning_1{node::Warning::CLOCK_OUT_OF_SYNC};
    const auto warning_2{node::Warning::FATAL_INTERNAL_ERROR};

    // Ensure we start without any warnings
    BOOST_CHECK(warnings.GetMessages().size() == 0);
    // Add two warnings
    BOOST_CHECK(warnings.Set(warning_1, _("warning 1")));
    BOOST_CHECK(warnings.Set(warning_2, _("warning 2")));
    // Unset the second one
    BOOST_CHECK(warnings.Unset(warning_2));
    // Since it's already been unset, this should return false
    BOOST_CHECK(!warnings.Unset(warning_2));
    // We should now be able to set w2 again
    BOOST_CHECK(warnings.Set(warning_2, _("warning 2 - revision 1")));
    // Setting w2 again should return false since it's already set
    BOOST_CHECK(!warnings.Set(warning_2, _("warning 2 - revision 2")));

    // Verify messages are correct
    const auto messages{warnings.GetMessages()};
    BOOST_CHECK(messages.size() == 2);
    BOOST_CHECK(messages[0].original == "warning 1");
    BOOST_CHECK(messages[1].original == "warning 2 - revision 1");

    // Clearing all warnings should also clear all messages
    BOOST_CHECK(warnings.Unset(warning_1));
    BOOST_CHECK(warnings.Unset(warning_2));
    BOOST_CHECK(warnings.GetMessages().size() == 0);
}